

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void prvTidyDefineMutedMessage(TidyDocImpl *doc,TidyOptionImpl *opt,ctmbstr name)

{
  tidyStrings tVar1;
  int iVar2;
  tidyStrings *__ptr;
  uint uVar3;
  uint uVar4;
  tidyStringsKeyItem *ptVar5;
  
  iVar2 = strcmp("TidyDiagnostics",name);
  if (iVar2 == 0) {
    ptVar5 = tidyStringsKeys;
  }
  else {
    uVar3 = 1;
    do {
      uVar4 = uVar3;
      if (tidyStringsKeys[uVar4].key == (char *)0x0) goto LAB_00150c18;
      iVar2 = strcmp(tidyStringsKeys[uVar4].key,name);
      uVar3 = uVar4 + 1;
    } while (iVar2 != 0);
    ptVar5 = tidyStringsKeys + uVar4;
  }
  tVar1 = ptVar5->value;
  if (0xffffff8f < tVar1 - REPORT_MESSAGE_LAST) {
    __ptr = (doc->muted).list;
    if (__ptr == (tidyStrings *)0x0) {
      __ptr = (tidyStrings *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x28);
      (doc->muted).list = __ptr;
      *__ptr = 0;
      (doc->muted).count = 0;
      (doc->muted).capacity = 10;
      uVar3 = 0;
    }
    else {
      uVar3 = (doc->muted).count;
      uVar4 = (doc->muted).capacity;
      if (uVar4 <= uVar3) {
        uVar4 = uVar4 * 2;
        (doc->muted).capacity = uVar4;
        __ptr = (tidyStrings *)realloc(__ptr,(ulong)uVar4 * 4 + 1);
        (doc->muted).list = __ptr;
        uVar3 = (doc->muted).count;
      }
    }
    __ptr[uVar3] = tVar1;
    uVar3 = (doc->muted).count + 1;
    (doc->muted).count = uVar3;
    __ptr[uVar3] = 0;
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x278,name);
    return;
  }
LAB_00150c18:
  prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x275,opt->name,name);
  return;
}

Assistant:

void TY_(DefineMutedMessage)(TidyDocImpl* doc, const TidyOptionImpl* opt, ctmbstr name)
{
    enum { capacity = 10 };
    TidyMutedMessages *list = &(doc->muted);
    tidyStrings message = TY_(tidyErrorCodeFromKey)( name );

    if ( message <= REPORT_MESSAGE_FIRST || message >= REPORT_MESSAGE_LAST)
    {
        TY_(Report)( doc, NULL, NULL, STRING_ARGUMENT_BAD, opt->name, name );
        return;
    }

    if ( !list->list )
    {
        list->list = TidyAlloc(doc->allocator, sizeof(tidyStrings) * capacity );
        list->list[0] = 0;
        list->capacity = capacity;
        list->count = 0;
    }

    if ( list->count >= list->capacity )
    {
        list->capacity = list->capacity * 2;
        list->list = realloc( list->list, sizeof(tidyStrings) * list->capacity + 1 );
    }

    list->list[list->count] = message;
    list->count++;
    list->list[list->count] = 0;

    /* Must come *after* adding to the list, in case it's muted, too. */
    TY_(Report)( doc, NULL, NULL, STRING_MUTING_TYPE, name );
}